

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_manager.hpp
# Opt level: O3

void __thiscall
duckdb::SingleFileStorageManager::~SingleFileStorageManager(SingleFileStorageManager *this)

{
  _Head_base<0UL,_duckdb::TableIOManager_*,_false> _Var1;
  _Head_base<0UL,_duckdb::BlockManager_*,_false> _Var2;
  
  (this->super_StorageManager)._vptr_StorageManager =
       (_func_int **)&PTR__SingleFileStorageManager_019793f8;
  _Var1._M_head_impl =
       (this->table_io_manager).
       super_unique_ptr<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>._M_t.
       super___uniq_ptr_impl<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::TableIOManager_*,_std::default_delete<duckdb::TableIOManager>_>
       .super__Head_base<0UL,_duckdb::TableIOManager_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (TableIOManager *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_TableIOManager[1])();
  }
  (this->table_io_manager).
  super_unique_ptr<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableIOManager_*,_std::default_delete<duckdb::TableIOManager>_>.
  super__Head_base<0UL,_duckdb::TableIOManager_*,_false>._M_head_impl = (TableIOManager *)0x0;
  _Var2._M_head_impl =
       (this->block_manager).
       super_unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
       super___uniq_ptr_impl<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::BlockManager_*,_std::default_delete<duckdb::BlockManager>_>.
       super__Head_base<0UL,_duckdb::BlockManager_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (BlockManager *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_BlockManager + 8))();
  }
  (this->block_manager).
  super_unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
  super___uniq_ptr_impl<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BlockManager_*,_std::default_delete<duckdb::BlockManager>_>.
  super__Head_base<0UL,_duckdb::BlockManager_*,_false>._M_head_impl = (BlockManager *)0x0;
  StorageManager::~StorageManager(&this->super_StorageManager);
  operator_delete(this);
  return;
}

Assistant:

SingleFileStorageManager() = delete;